

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCString.h
# Opt level: O1

ostream * operator<<(ostream *ostr,gcstring *str)

{
  char *__s;
  size_t sVar1;
  
  __s = (char *)(**(code **)(*(long *)str + 0x48))(str);
  if (__s == (char *)0x0) {
    std::ios::clear((int)ostr + (int)*(undefined8 *)(*(long *)ostr + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(ostr,__s,sVar1);
  }
  return ostr;
}

Assistant:

inline std::ostream & operator <<(std::ostream &ostr, const GENICAM_NAMESPACE::gcstring &str)
{
    try
    {
        // use formatted output operator of std::string
        ostr << str.c_str();
    }
    catch(std::bad_alloc &)
    {
        GENICAM_NAMESPACE::ThrowBadAlloc(__FILE__, __LINE__);
    }
    return ostr;
}